

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O1

void operator_delete__(void *__ptr)

{
  ThreadCache *this;
  void *pvVar1;
  int iVar2;
  ulong uVar3;
  Span *span;
  ulong uVar4;
  uint uVar5;
  undefined8 *in_FS_OFFSET;
  
  if (base::internal::delete_hooks_ != 0) {
    tcmalloc::invoke_hooks_and_free(__ptr);
    return;
  }
  this = (ThreadCache *)*in_FS_OFFSET;
  uVar3 = (ulong)__ptr >> 0xd;
  uVar4 = *(ulong *)(tcmalloc::Static::pageheap_ + (uVar3 & 0xffff) * 8 + 0x10) ^
          uVar3 & 0xffffffffffff0000;
  if (0x7f < uVar4) {
    if (((ulong)__ptr >> 0x30 == 0) &&
       (*(long *)(tcmalloc::Static::pageheap_ + ((ulong)__ptr >> 0x1f) * 8 + 0x80010) != 0)) {
      span = *(Span **)(*(long *)(tcmalloc::Static::pageheap_ + ((ulong)__ptr >> 0x1f) * 8 + 0x80010
                                 ) + (ulong)((uint)uVar3 & 0x3ffff) * 8);
    }
    else {
      span = (Span *)0x0;
    }
    if (span == (Span *)0x0) goto LAB_0010efd8;
    uVar4 = (ulong)(byte)span->field_0x2a;
    if (uVar4 == 0) {
      anon_unknown.dwarf_5169::do_free_pages(span,__ptr);
      return;
    }
    *(ulong *)(tcmalloc::Static::pageheap_ + (uVar3 & 0xffff) * 8 + 0x10) =
         uVar3 & 0xffffffffffff0000 | uVar4;
  }
  if (this != (ThreadCache *)0x0) {
    uVar3 = uVar4 & 0xffffffff;
    uVar5 = this->list_[uVar3].length_ + 1;
    pvVar1 = this->list_[uVar3].list_;
    this->list_[uVar3].list_ = __ptr;
    *(void **)__ptr = pvVar1;
    this->list_[uVar3].length_ = uVar5;
    if (this->list_[uVar3].max_length_ < uVar5) {
      tcmalloc::ThreadCache::ListTooLong(this,this->list_ + uVar3,(uint32_t)uVar4);
      return;
    }
    iVar2 = this->size_ + this->list_[uVar3].size_;
    this->size_ = iVar2;
    if (iVar2 <= this->max_size_) {
      return;
    }
    tcmalloc::ThreadCache::Scavenge(this);
    return;
  }
  if (tcmalloc::Static::inited_ != '\0') {
    *(undefined8 *)__ptr = 0;
    tcmalloc::CentralFreeList::InsertRange
              ((CentralFreeList *)(&tcmalloc::Static::central_cache_ + (uVar4 & 0xffffffff) * 0x130)
               ,__ptr,__ptr,1);
    return;
  }
LAB_0010efd8:
  if (__ptr == (void *)0x0) {
    return;
  }
  anon_unknown.dwarf_5169::InvalidFree(__ptr);
  return;
}

Assistant:

PERFTOOLS_DLL_DECL CACHELINE_ALIGNED_FN
void tc_free(void* ptr) PERFTOOLS_NOTHROW {
  free_fast_path(ptr);
}